

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pool.h
# Opt level: O1

CharItem * __thiscall
Hpipe::Pool<Hpipe::CharItem,_32>::New<Hpipe::Cond>(Pool<Hpipe::CharItem,_32> *this,Cond *args)

{
  int iVar1;
  Set *pSVar2;
  CharItem *this_00;
  Cond CStack_38;
  
  if (this->used == 0x20) {
    pSVar2 = (Set *)operator_new(0x1108);
    pSVar2->prev = this->last;
    this->last = pSVar2;
    this->used = 0;
  }
  iVar1 = this->used;
  this->used = iVar1 + 1;
  this_00 = (CharItem *)(this->last->items + (long)iVar1 * 0x88);
  Cond::Cond(&CStack_38,args);
  CharItem::CharItem(this_00,&CStack_38);
  return this_00;
}

Assistant:

T *New( Args&&... args ) {
        if ( used == s ) {
            Set *n = new Set;
            n->prev = last;
            last = n;
            used = 0;
        }
        return new ( last->items + sizeof( T ) * used++ ) T( std::forward<Args>( args )... );
    }